

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O0

FieldGenerator *
google::protobuf::compiler::cpp::FieldGeneratorMap::MakeGenerator
          (FieldDescriptor *field,Options *options)

{
  bool bVar1;
  CppType CVar2;
  FieldOptions *pFVar3;
  Options *options_local;
  FieldDescriptor *field_local;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (CVar2 == CPPTYPE_ENUM) {
      field_local = (FieldDescriptor *)operator_new(0x40);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)field_local,field,options);
    }
    else if (CVar2 == CPPTYPE_STRING) {
      pFVar3 = FieldDescriptor::options(field);
      FieldOptions::ctype(pFVar3);
      field_local = (FieldDescriptor *)operator_new(0x40);
      RepeatedStringFieldGenerator::RepeatedStringFieldGenerator
                ((RepeatedStringFieldGenerator *)field_local,field,options);
    }
    else if (CVar2 == CPPTYPE_MESSAGE) {
      field_local = (FieldDescriptor *)operator_new(0x40);
      RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                ((RepeatedMessageFieldGenerator *)field_local,field,options);
    }
    else {
      field_local = (FieldDescriptor *)operator_new(0x40);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)field_local,field,options);
    }
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (CVar2 == CPPTYPE_ENUM) {
      field_local = (FieldDescriptor *)operator_new(0x40);
      EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)field_local,field,options);
    }
    else if (CVar2 == CPPTYPE_STRING) {
      pFVar3 = FieldDescriptor::options(field);
      FieldOptions::ctype(pFVar3);
      field_local = (FieldDescriptor *)operator_new(0x40);
      StringFieldGenerator::StringFieldGenerator((StringFieldGenerator *)field_local,field,options);
    }
    else if (CVar2 == CPPTYPE_MESSAGE) {
      field_local = (FieldDescriptor *)operator_new(0x40);
      MessageFieldGenerator::MessageFieldGenerator
                ((MessageFieldGenerator *)field_local,field,options);
    }
    else {
      field_local = (FieldDescriptor *)operator_new(0x40);
      PrimitiveFieldGenerator::PrimitiveFieldGenerator
                ((PrimitiveFieldGenerator *)field_local,field,options);
    }
  }
  return (FieldGenerator *)field_local;
}

Assistant:

FieldGenerator* FieldGeneratorMap::MakeGenerator(const FieldDescriptor* field,
                                                 const Options& options) {
  if (field->is_repeated()) {
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_MESSAGE:
        return new RepeatedMessageFieldGenerator(field, options);
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // RepeatedStringFieldGenerator handles unknown ctypes.
          case FieldOptions::STRING:
            return new RepeatedStringFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_ENUM:
        return new RepeatedEnumFieldGenerator(field, options);
      default:
        return new RepeatedPrimitiveFieldGenerator(field, options);
    }
  } else {
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_MESSAGE:
        return new MessageFieldGenerator(field, options);
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // StringFieldGenerator handles unknown ctypes.
          case FieldOptions::STRING:
            return new StringFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_ENUM:
        return new EnumFieldGenerator(field, options);
      default:
        return new PrimitiveFieldGenerator(field, options);
    }
  }
}